

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O1

bool __thiscall Pig::getDecimal(Pig *this,double *result)

{
  bool bVar1;
  double dVar2;
  string s;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  bVar1 = getDecimal(this,&local_38);
  if (bVar1) {
    dVar2 = strtod(local_38._M_dataplus._M_p,(char **)0x0);
    *result = dVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool Pig::getDecimal (double& result)
{
  std::string s;
  if (getDecimal (s))
  {
    result = std::strtod (s.c_str (), nullptr);
    return true;
  }

  return false;
}